

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O2

void tcp_pinger_new(int vectored_writes)

{
  int iVar1;
  int *piVar2;
  uv_loop_t *loop;
  undefined8 uVar3;
  char *pcVar4;
  sockaddr_in server_addr;
  sockaddr_in sStack_28;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_28);
  if (iVar1 == 0) {
    piVar2 = (int *)malloc(0x2978);
    if (piVar2 == (int *)0x0) {
      pcVar4 = "pinger != NULL";
      uVar3 = 0xcf;
    }
    else {
      *piVar2 = vectored_writes;
      piVar2[1] = 0;
      piVar2[2] = 0;
      loop = uv_default_loop();
      iVar1 = uv_tcp_init(loop,(uv_tcp_t *)(piVar2 + 4));
      *(int **)(piVar2 + 4) = piVar2;
      if (iVar1 == 0) {
        iVar1 = uv_tcp_connect((uv_connect_t *)(piVar2 + 0x46),(uv_tcp_t *)(piVar2 + 4),
                               (sockaddr *)&sStack_28,pinger_on_connect);
        if (iVar1 == 0) {
          if (pinger_on_connect_count == 0) {
            return;
          }
          pcVar4 = "pinger_on_connect_count == 0";
          uVar3 = 0xe2;
        }
        else {
          pcVar4 = "!r";
          uVar3 = 0xdf;
        }
      }
      else {
        pcVar4 = "!r";
        uVar3 = 0xd7;
      }
    }
  }
  else {
    pcVar4 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &server_addr)";
    uVar3 = 0xcd;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ping-pong.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

static void tcp_pinger_new(int vectored_writes) {
  int r;
  struct sockaddr_in server_addr;
  pinger_t *pinger;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &server_addr));
  pinger = malloc(sizeof(*pinger));
  ASSERT(pinger != NULL);
  pinger->vectored_writes = vectored_writes;
  pinger->state = 0;
  pinger->pongs = 0;

  /* Try to connect to the server and do NUM_PINGS ping-pongs. */
  r = uv_tcp_init(uv_default_loop(), &pinger->stream.tcp);
  pinger->stream.tcp.data = pinger;
  ASSERT(!r);

  /* We are never doing multiple reads/connects at a time anyway, so these
   * handles can be pre-initialized. */
  r = uv_tcp_connect(&pinger->connect_req,
                     &pinger->stream.tcp,
                     (const struct sockaddr*) &server_addr,
                     pinger_on_connect);
  ASSERT(!r);

  /* Synchronous connect callbacks are not allowed. */
  ASSERT(pinger_on_connect_count == 0);
}